

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O2

void __thiscall ON_String::ON_String(ON_String *this,ON_String *src)

{
  char *pcVar1;
  ON_Internal_Empty_aString *pOVar2;
  
  pcVar1 = &empty_astring.s;
  if ((src->m_s != (char *)0x0) &&
     (pOVar2 = (ON_Internal_Empty_aString *)(src->m_s + -0xc), pOVar2 != &empty_astring)) {
    LOCK();
    (pOVar2->header).ref_count.super___atomic_base<int>._M_i =
         (pOVar2->header).ref_count.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pcVar1 = src->m_s;
  }
  this->m_s = pcVar1;
  return;
}

Assistant:

ON_aStringHeader* ON_String::IncrementedHeader() const
{
  ON_aStringHeader* hdr = (ON_aStringHeader*)m_s;
  if (nullptr == hdr)
    return nullptr;
  
  hdr--;
  if (hdr == pEmptyStringHeader)
    return nullptr;

  //ON_AtomicIncrementInt32(&hdr->ref_count);
  ++hdr->ref_count;
  return hdr;
}